

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_test.c
# Opt level: O1

bool_t ecpTest(void)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  qr_o *r;
  word d;
  octet t [160];
  octet state [2048];
  octet stack [2048];
  word local_10f8;
  size_t local_10f0;
  size_t local_10e8;
  size_t local_10e0;
  char local_10d8 [32];
  octet local_10b8 [32];
  word local_1098 [12];
  ec_o local_1038 [11];
  undefined1 local_838 [2056];
  uint uVar8;
  
  sVar2 = gfpCreate_keep(0x20);
  sVar3 = ecpCreateJ_keep(4);
  sVar4 = gfpCreate_deep(0x20);
  uVar7 = 0;
  uVar8 = 0;
  if (sVar4 < 0x801 && sVar3 + sVar2 < 0x801) {
    hexToRev(local_10d8,p);
    r = (qr_o *)((long)&local_1038[0].hdr.keep + sVar3);
    bVar1 = gfpCreate(r,(octet *)local_10d8,0x20,local_838);
    if (bVar1 != 0) {
      hexToRev(local_10d8,a);
      hexToRev(local_10b8,b);
      sVar3 = ecpCreateJ_deep(4,sVar4);
      if (sVar3 < 0x801) {
        bVar1 = ecpCreateJ(local_1038,r,(octet *)local_10d8,local_10b8,local_838);
        uVar7 = uVar8;
        if (bVar1 != 0) {
          hexToRev(local_10d8,xbase);
          hexToRev(local_10b8,ybase);
          hexToRev(local_1098,q);
          sVar3 = ecCreateGroup_deep(sVar4);
          if (sVar3 < 0x801) {
            bVar1 = ecCreateGroup(local_1038,(octet *)local_10d8,local_10b8,(octet *)local_1098,0x20
                                  ,1,local_838);
            if (bVar1 != 0) {
              uVar7 = 0;
              objAppend(local_1038,r,0);
              sVar3 = ecpIsValid_deep(4,sVar4);
              if (sVar3 < 0x801) {
                bVar1 = ecpIsValid(local_1038,local_838);
                if (bVar1 != 0) {
                  sVar3 = ecpSeemsValidGroup_deep(4,sVar4);
                  if (sVar3 < 0x801) {
                    bVar1 = ecpSeemsValidGroup(local_1038,local_838);
                    if (bVar1 != 0) {
                      sVar3 = ecpIsSafeGroup_deep(4);
                      if (sVar3 < 0x801) {
                        bVar1 = ecpIsSafeGroup(local_1038,0x28,local_838);
                        if (bVar1 != 0) {
                          sVar3 = ecHasOrderA_deep(4,local_1038[0].d,local_1038[0].deep,4);
                          if (sVar3 < 0x801) {
                            bVar1 = ecHasOrderA(local_1038[0].base,local_1038,local_1038[0].order,4,
                                                local_838);
                            if ((bVar1 != 0) && (0xffffffffffffff5e < local_1038[0].d * 0x20 - 0x61)
                               ) {
                              local_10e0 = local_1038[0].deep;
                              local_10e8 = ecpIsOnA_deep(4,sVar4);
                              local_10f0 = ecpAddAA_deep(4,sVar4);
                              sVar3 = ecpSubAA_deep(4,sVar4);
                              sVar5 = ecMulA_deep(4,local_1038[0].d,local_1038[0].deep,1);
                              uVar7 = 0;
                              sVar3 = utilMax(5,local_10e0,local_10e8,local_10f0,sVar3,sVar5);
                              if (sVar3 < 0x801) {
                                local_10f8 = 3;
                                bVar1 = ecpIsOnA(local_1038[0].base,local_1038,local_838);
                                if (bVar1 != 0) {
                                  bVar1 = ecpAddAA((word *)local_10d8,local_1038[0].base,
                                                   local_1038[0].base,local_1038,local_838);
                                  if (bVar1 != 0) {
                                    bVar1 = ecpAddAA((word *)local_10d8,(word *)local_10d8,
                                                     local_1038[0].base,local_1038,local_838);
                                    if (bVar1 != 0) {
                                      bVar1 = ecpAddAA(local_1098,local_1038[0].base,
                                                       local_1038[0].base,local_1038,local_838);
                                      if (bVar1 != 0) {
                                        bVar1 = ecpAddAA(local_1098,local_1098,local_1098,local_1038
                                                         ,local_838);
                                        if (bVar1 != 0) {
                                          bVar1 = ecpSubAA(local_1098,local_1098,local_1038[0].base,
                                                           local_1038,local_838);
                                          if (bVar1 != 0) {
                                            bVar1 = memEq(local_10d8,local_1098,8);
                                            if (bVar1 != 0) {
                                              ecpNegA(local_1098,local_1098,local_1038);
                                              bVar1 = ecpAddAA(local_1098,(word *)local_10d8,
                                                               local_1098,local_1038,local_838);
                                              if (bVar1 == 0) {
                                                bVar1 = ecMulA(local_1098,local_1038[0].base,
                                                               local_1038,&local_10f8,1,local_838);
                                                if (bVar1 != 0) {
                                                  bVar1 = memEq(local_10d8,local_1098,8);
                                                  if ((((bVar1 != 0) &&
                                                       (local_1038[0].froma != (ec_froma_i)0x0)) &&
                                                      (local_1038[0].tpl != (ec_tpl_i)0x0)) &&
                                                     (local_1038[0].toa != (ec_toa_i)0x0)) {
                                                    (*local_1038[0].froma)
                                                              (local_1098,local_1038[0].base,
                                                               local_1038,local_838);
                                                    (*local_1038[0].tpl)
                                                              (local_1098,local_1098,local_1038,
                                                               local_838);
                                                    (*local_1038[0].toa)
                                                              (local_1098,local_1098,local_1038,
                                                               local_838);
                                                    bVar1 = memEq(local_10d8,local_1098,8);
                                                    if (bVar1 != 0) {
                                                      memMove(r,local_1038[0].f,sVar2);
                                                      hexToRev(local_10d8,a);
                                                      local_10d8[0] = local_10d8[0] + 0xff;
                                                      hexToRev(local_10b8,b);
                                                      sVar2 = ecpCreateJ_deep(4,sVar4);
                                                      if (sVar2 < 0x801) {
                                                        bVar1 = ecpCreateJ(local_1038,r,
                                                                           (octet *)local_10d8,
                                                                           local_10b8,local_838);
                                                        if (bVar1 != 0) {
                                                          uVar7 = 0;
                                                          objAppend(local_1038,r,0);
                                                          hexToRev(local_10d8,xbase);
                                                          hexToRev(local_10b8,ybase);
                                                          u64From(local_1038[0].base,local_10d8,0x20
                                                                 );
                                                          u64From(local_1038[0].base + 4,local_10b8,
                                                                  0x20);
                                                          sVar2 = local_1038[0].deep;
                                                          if (0xffffffffffffff5e <
                                                              local_1038[0].d * 0x20 - 0x61) {
                                                            sVar3 = ecpIsOnA_deep(4,sVar4);
                                                            sVar5 = ecpAddAA_deep(4,sVar4);
                                                            sVar4 = ecpSubAA_deep(4,sVar4);
                                                            sVar6 = ecMulA_deep(4,local_1038[0].d,
                                                                                local_1038[0].deep,1
                                                                               );
                                                            uVar7 = 0;
                                                            sVar2 = utilMax(5,sVar2,sVar3,sVar5,
                                                                            sVar4,sVar6);
                                                            if (sVar2 < 0x801) {
                                                              local_10f8 = 3;
                                                              bVar1 = ecpIsOnA(local_1038[0].base,
                                                                               local_1038,local_838)
                                                              ;
                                                              uVar7 = 0;
                                                              if (bVar1 != 0) {
                                                                bVar1 = ecpAddAA((word *)local_10d8,
                                                                                 local_1038[0].base,
                                                                                 local_1038[0].base,
                                                                                 local_1038,
                                                                                 local_838);
                                                                if (bVar1 != 0) {
                                                                  bVar1 = ecpAddAA((word *)
                                                  local_10d8,(word *)local_10d8,local_1038[0].base,
                                                  local_1038,local_838);
                                                  if (bVar1 != 0) {
                                                    bVar1 = ecpAddAA(local_1098,local_1038[0].base,
                                                                     local_1038[0].base,local_1038,
                                                                     local_838);
                                                    if (bVar1 != 0) {
                                                      bVar1 = ecpAddAA(local_1098,local_1098,
                                                                       local_1098,local_1038,
                                                                       local_838);
                                                      if (bVar1 != 0) {
                                                        bVar1 = ecpSubAA(local_1098,local_1098,
                                                                         local_1038[0].base,
                                                                         local_1038,local_838);
                                                        if (bVar1 != 0) {
                                                          bVar1 = memEq(local_10d8,local_1098,8);
                                                          if (bVar1 != 0) {
                                                            ecpNegA(local_1098,local_1098,local_1038
                                                                   );
                                                            bVar1 = ecpAddAA(local_1098,
                                                                             (word *)local_10d8,
                                                                             local_1098,local_1038,
                                                                             local_838);
                                                            if (bVar1 == 0) {
                                                              bVar1 = ecMulA(local_1098,
                                                                             local_1038[0].base,
                                                                             local_1038,&local_10f8,
                                                                             1,local_838);
                                                              if (bVar1 != 0) {
                                                                bVar1 = memEq(local_10d8,local_1098,
                                                                              8);
                                                                if (((bVar1 != 0) &&
                                                                    (local_1038[0].froma !=
                                                                     (ec_froma_i)0x0)) &&
                                                                   ((local_1038[0].tpl !=
                                                                     (ec_tpl_i)0x0 &&
                                                                    (local_1038[0].toa !=
                                                                     (ec_toa_i)0x0)))) {
                                                                  (*local_1038[0].froma)
                                                                            (local_1098,
                                                                             local_1038[0].base,
                                                                             local_1038,local_838);
                                                                  (*local_1038[0].tpl)
                                                                            (local_1098,local_1098,
                                                                             local_1038,local_838);
                                                                  (*local_1038[0].toa)
                                                                            (local_1098,local_1098,
                                                                             local_1038,local_838);
                                                                  bVar1 = memEq(local_10d8,
                                                                                local_1098,8);
                                                                  uVar7 = (uint)(bVar1 != 0);
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar7;
}

Assistant:

bool_t ecpTest()
{
	// размерности
	const size_t n = W_OF_O(no);
	const size_t f_keep = gfpCreate_keep(no);
	const size_t ec_keep = ecpCreateJ_keep(n);
	const size_t f_deep = gfpCreate_deep(no);
	// состояние и стек
	octet state[2048];
	octet stack[2048];
	octet t[32 * 5];
	// поле и эк
	qr_o* f;
	ec_o* ec;
	// подготовить память
	if (sizeof(state) < f_keep + ec_keep ||
		sizeof(stack) < f_deep ||
		sizeof(t) < 3 * no)
		return FALSE;
	// создать f = GF(p)
	hexToRev(t, p);
	f = (qr_o*)(state + ec_keep);
	if (!gfpCreate(f, t, no, stack))
		return FALSE;
	// создать ec = EC_{ab}(f)
	hexToRev(t, a), hexToRev(t + no, b);
	ec = (ec_o*)state;
	if (sizeof(stack) < ecpCreateJ_deep(n, f_deep) ||
		!ecpCreateJ(ec, f, t, t + no, stack))
		return FALSE;
	// создать группу точек ec
	hexToRev(t, xbase), hexToRev(t + no, ybase), hexToRev(t + 2 * no, q);
	if (sizeof(stack) < ecCreateGroup_deep(f_deep) ||
		!ecCreateGroup(ec, t, t + no, t + 2 * no, no, cofactor, stack))
		return FALSE;
	// присоединить f к ec
	objAppend(ec, f, 0);
	// корректная кривая?
	if (sizeof(stack) < ecpIsValid_deep(n, f_deep) ||
		!ecpIsValid(ec, stack))
		return FALSE;
	// корректная группа?
	if (sizeof(stack) < ecpSeemsValidGroup_deep(n, f_deep) ||
		!ecpSeemsValidGroup(ec, stack))
		return FALSE;
	// надежная группа?
	if (sizeof(stack) < ecpIsSafeGroup_deep(n) ||
		!ecpIsSafeGroup(ec, 40, stack))
		return FALSE;
	// базовая точка имеет порядок q?
	if (sizeof(stack) < ecHasOrderA_deep(n, ec->d, ec->deep, n) ||
		!ecHasOrderA(ec->base, ec, ec->order, n, stack))
		return FALSE;
	// утроить базовую точку разными способами
	if (sizeof(t) < (2 + ec->d) * no ||
		sizeof(stack) < utilMax(5,
			ec->deep,
			ecpIsOnA_deep(n, f_deep),
			ecpAddAA_deep(n, f_deep),
			ecpSubAA_deep(n, f_deep),
			ecMulA_deep(n, ec->d, ec->deep, 1)))
		return FALSE;
	{
		word* pts = (word*)t;
		word d = 3;
		// удвоить и сложить
		if (!ecpIsOnA(ec->base, ec, stack) ||
			!ecpAddAA(pts, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts, pts, ec->base, ec, stack))
			return FALSE;
		// дважды удвоить и вычесть
		if (!ecpAddAA(pts + 2 * n, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts + 2 * n, pts + 2 * n, pts + 2 * n, ec, stack) ||
			!ecpSubAA(pts + 2 * n, pts + 2 * n, ec->base, ec, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		ecpNegA(pts + 2 * n, pts + 2 * n, ec);
		if (ecpAddAA(pts + 2 * n, pts, pts + 2 * n, ec, stack))
			return FALSE;
		// вычислить кратную точку
		if (!ecMulA(pts + 2 * n, ec->base, ec, &d, 1, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		// утроить напрямую
		if (!ec->froma || !ec->tpl || !ec->toa)
			return FALSE;
		ec->froma(pts + 2 * n, ec->base, ec, stack);
		ec->tpl(pts + 2 * n, pts + 2 * n, ec, stack);
		ec->toa(pts + 2 * n, pts + 2 * n, ec, stack);
		if (!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
	}
	// вывести f = GF(p) за пределы ec
	f = (qr_o*)(state + ec_keep);
	memMove(f, objPtr(ec, 0, qr_o), f_keep);
	// создать ec = EC_{a-1, b}(f)
	hexToRev(t, a), --t[0], hexToRev(t + no, b);
	ec = (ec_o*)state;
	if (sizeof(stack) < ecpCreateJ_deep(n, f_deep) ||
		!ecpCreateJ(ec, f, t, t + no, stack))
		return FALSE;
	// присоединить f к ec
	objAppend(ec, f, 0);
	// точка (xbase = 0, ybase) все еще лежит на ec: ybase^2 = b
	hexToRev(t, xbase), hexToRev(t + no, ybase);
	wwFrom(ec->base, t, no), wwFrom(ec->base + n, t + no, no);
	ASSERT(wwIsZero(ec->base, n));
	// утроить базовую точку разными способами
	if (sizeof(t) < (2 + ec->d) * no ||
		sizeof(stack) < utilMax(5,
			ec->deep,
			ecpIsOnA_deep(n, f_deep),
			ecpAddAA_deep(n, f_deep),
			ecpSubAA_deep(n, f_deep),
			ecMulA_deep(n, ec->d, ec->deep, 1)))
		return FALSE;
	{
		word* pts = (word*)t;
		word d = 3;
		// удвоить и сложить
		if (!ecpIsOnA(ec->base, ec, stack) ||
			!ecpAddAA(pts, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts, pts, ec->base, ec, stack))
			return FALSE;
		// дважды удвоить и вычесть
		if (!ecpAddAA(pts + 2 * n, ec->base, ec->base, ec, stack) ||
			!ecpAddAA(pts + 2 * n, pts + 2 * n, pts + 2 * n, ec, stack) ||
			!ecpSubAA(pts + 2 * n, pts + 2 * n, ec->base, ec, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		ecpNegA(pts + 2 * n, pts + 2 * n, ec);
		if (ecpAddAA(pts + 2 * n, pts, pts + 2 * n, ec, stack))
			return FALSE;
		// вычислить кратную точку
		if (!ecMulA(pts + 2 * n, ec->base, ec, &d, 1, stack) ||
			!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
		// утроить напрямую
		if (!ec->froma || !ec->tpl || !ec->toa)
			return FALSE;
		ec->froma(pts + 2 * n, ec->base, ec, stack);
		ec->tpl(pts + 2 * n, pts + 2 * n, ec, stack);
		ec->toa(pts + 2 * n, pts + 2 * n, ec, stack);
		if (!memEq(pts, pts + 2 * n, 2 * n))
			return FALSE;
	}
	// все нормально
	return TRUE;
}